

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Entity_State_PDU::Entity_State_PDU(Entity_State_PDU *this,Entity_State_PDU *ESPDU)

{
  undefined8 uVar1;
  DeadReckoningCalculator *pDVar2;
  KFLOAT64 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  KUINT16 KVar7;
  KUINT8 KVar8;
  KUINT8 KVar9;
  KFLOAT32 KVar10;
  KOCTET KVar11;
  KOCTET KVar12;
  KOCTET KVar13;
  KOCTET KVar14;
  KOCTET KVar15;
  KOCTET KVar16;
  KOCTET KVar17;
  KCHAR8 KVar18;
  KCHAR8 KVar19;
  KCHAR8 KVar20;
  KCHAR8 KVar21;
  KCHAR8 KVar22;
  KCHAR8 KVar23;
  KCHAR8 KVar24;
  DeadReckoningCalculator *pDVar25;
  long lVar26;
  TMATRIX *pTVar27;
  TMATRIX *pTVar28;
  byte bVar29;
  
  bVar29 = 0;
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Header6_00220ca8;
  KVar4 = (ESPDU->super_Header).super_Header6.m_ui8ExerciseID;
  KVar5 = (ESPDU->super_Header).super_Header6.m_ui8PDUType;
  KVar6 = (ESPDU->super_Header).super_Header6.m_ui8ProtocolFamily;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion =
       (ESPDU->super_Header).super_Header6.m_ui8ProtocolVersion;
  (this->super_Header).super_Header6.m_ui8ExerciseID = KVar4;
  (this->super_Header).super_Header6.m_ui8PDUType = KVar5;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = KVar6;
  (this->super_Header).super_Header6.m_TimeStamp.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__TimeStamp_002238b8;
  (this->super_Header).super_Header6.m_TimeStamp.m_TimeStampUnion =
       (ESPDU->super_Header).super_Header6.m_TimeStamp.m_TimeStampUnion;
  (this->super_Header).super_Header6.m_TimeStamp.m_bAutoCalcRel =
       (ESPDU->super_Header).super_Header6.m_TimeStamp.m_bAutoCalcRel;
  KVar4 = (ESPDU->super_Header).super_Header6.m_ui8Padding1;
  KVar5 = (ESPDU->super_Header).super_Header6.m_ui8Padding2;
  (this->super_Header).super_Header6.m_ui16PDULength =
       (ESPDU->super_Header).super_Header6.m_ui16PDULength;
  (this->super_Header).super_Header6.m_ui8Padding1 = KVar4;
  (this->super_Header).super_Header6.m_ui8Padding2 = KVar5;
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Header7_00220cf8;
  (this->super_Header).super_Header6.field_0x26 = (ESPDU->super_Header).super_Header6.field_0x26;
  *(undefined2 *)&(this->super_Header).super_Header6.field_0x24 =
       *(undefined2 *)&(ESPDU->super_Header).super_Header6.field_0x24;
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Entity_State_PDU_00220f90;
  (this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223808;
  KVar7 = (ESPDU->m_EntityID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->m_EntityID).super_SimulationIdentifier.m_ui16SiteID =
       (ESPDU->m_EntityID).super_SimulationIdentifier.m_ui16SiteID;
  (this->m_EntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar7;
  (this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_002234a8;
  *(undefined2 *)&(this->m_EntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(ESPDU->m_EntityID).super_SimulationIdentifier.field_0xc;
  this->m_ui8ForceID = ESPDU->m_ui8ForceID;
  this->m_ui8NumOfVariableParams = ESPDU->m_ui8NumOfVariableParams;
  (this->m_EntityType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223558;
  KVar4 = (ESPDU->m_EntityType).m_ui8Domain;
  KVar7 = (ESPDU->m_EntityType).m_ui16Country;
  KVar5 = (ESPDU->m_EntityType).m_ui8Category;
  KVar6 = (ESPDU->m_EntityType).m_ui8SubCategory;
  KVar8 = (ESPDU->m_EntityType).m_ui8Specific;
  KVar9 = (ESPDU->m_EntityType).m_ui8Extra;
  (this->m_EntityType).m_ui8EntityKind = (ESPDU->m_EntityType).m_ui8EntityKind;
  (this->m_EntityType).m_ui8Domain = KVar4;
  (this->m_EntityType).m_ui16Country = KVar7;
  (this->m_EntityType).m_ui8Category = KVar5;
  (this->m_EntityType).m_ui8SubCategory = KVar6;
  (this->m_EntityType).m_ui8Specific = KVar8;
  (this->m_EntityType).m_ui8Extra = KVar9;
  (this->m_AltEntityType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223558;
  KVar4 = (ESPDU->m_AltEntityType).m_ui8Domain;
  KVar7 = (ESPDU->m_AltEntityType).m_ui16Country;
  KVar5 = (ESPDU->m_AltEntityType).m_ui8Category;
  KVar6 = (ESPDU->m_AltEntityType).m_ui8SubCategory;
  KVar8 = (ESPDU->m_AltEntityType).m_ui8Specific;
  KVar9 = (ESPDU->m_AltEntityType).m_ui8Extra;
  (this->m_AltEntityType).m_ui8EntityKind = (ESPDU->m_AltEntityType).m_ui8EntityKind;
  (this->m_AltEntityType).m_ui8Domain = KVar4;
  (this->m_AltEntityType).m_ui16Country = KVar7;
  (this->m_AltEntityType).m_ui8Category = KVar5;
  (this->m_AltEntityType).m_ui8SubCategory = KVar6;
  (this->m_AltEntityType).m_ui8Specific = KVar8;
  (this->m_AltEntityType).m_ui8Extra = KVar9;
  (this->m_EntityLinearVelocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223ad0;
  KVar10 = (ESPDU->m_EntityLinearVelocity).m_f32Y;
  (this->m_EntityLinearVelocity).m_f32X = (ESPDU->m_EntityLinearVelocity).m_f32X;
  (this->m_EntityLinearVelocity).m_f32Y = KVar10;
  (this->m_EntityLinearVelocity).m_f32Z = (ESPDU->m_EntityLinearVelocity).m_f32Z;
  (this->m_EntityLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223b28;
  KVar3 = (ESPDU->m_EntityLocation).m_f64Y;
  (this->m_EntityLocation).m_f64X = (ESPDU->m_EntityLocation).m_f64X;
  (this->m_EntityLocation).m_f64Y = KVar3;
  (this->m_EntityLocation).m_f64Z = (ESPDU->m_EntityLocation).m_f64Z;
  (this->m_EntityOrientation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EulerAngles_002235b0;
  KVar10 = (ESPDU->m_EntityOrientation).m_f32Theta;
  (this->m_EntityOrientation).m_f32Psi = (ESPDU->m_EntityOrientation).m_f32Psi;
  (this->m_EntityOrientation).m_f32Theta = KVar10;
  (this->m_EntityOrientation).m_f32Phi = (ESPDU->m_EntityOrientation).m_f32Phi;
  (this->m_EntityAppearance).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityAppearance_002233f8;
  (this->m_EntityAppearance).m_Appearance = (ESPDU->m_EntityAppearance).m_Appearance;
  (this->m_DeadReckoningParameter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DeadReckoningParameter_002231e8;
  KVar11 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[0];
  KVar12 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[1];
  KVar13 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[2];
  KVar14 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[3];
  KVar15 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[4];
  KVar16 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[5];
  KVar17 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[6];
  uVar1 = *(undefined8 *)((ESPDU->m_DeadReckoningParameter).m_OtherParams + 7);
  (this->m_DeadReckoningParameter).m_ui8DeadRecknoningAlgorithm =
       (ESPDU->m_DeadReckoningParameter).m_ui8DeadRecknoningAlgorithm;
  (this->m_DeadReckoningParameter).m_OtherParams[0] = KVar11;
  (this->m_DeadReckoningParameter).m_OtherParams[1] = KVar12;
  (this->m_DeadReckoningParameter).m_OtherParams[2] = KVar13;
  (this->m_DeadReckoningParameter).m_OtherParams[3] = KVar14;
  (this->m_DeadReckoningParameter).m_OtherParams[4] = KVar15;
  (this->m_DeadReckoningParameter).m_OtherParams[5] = KVar16;
  (this->m_DeadReckoningParameter).m_OtherParams[6] = KVar17;
  *(undefined8 *)((this->m_DeadReckoningParameter).m_OtherParams + 7) = uVar1;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223ad0;
  KVar10 = (ESPDU->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Y;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32X =
       (ESPDU->m_DeadReckoningParameter).m_LinearAcceleration.m_f32X;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Y = KVar10;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Z =
       (ESPDU->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Z;
  (this->m_DeadReckoningParameter).m_AngularVelocity.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223ad0;
  KVar10 = (ESPDU->m_DeadReckoningParameter).m_AngularVelocity.m_f32Y;
  (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32X =
       (ESPDU->m_DeadReckoningParameter).m_AngularVelocity.m_f32X;
  (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32Y = KVar10;
  (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32Z =
       (ESPDU->m_DeadReckoningParameter).m_AngularVelocity.m_f32Z;
  (this->m_EntityMarking).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityMarking_00223500;
  KVar18 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[0];
  KVar19 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[1];
  KVar20 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[2];
  KVar21 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[3];
  KVar22 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[4];
  KVar23 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[5];
  KVar24 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[6];
  uVar1 = *(undefined8 *)((ESPDU->m_EntityMarking).m_sEntityMarkingString + 4);
  (this->m_EntityMarking).m_ui8EntityMarkingCharacterSet =
       (ESPDU->m_EntityMarking).m_ui8EntityMarkingCharacterSet;
  (this->m_EntityMarking).m_sEntityMarkingString[0] = KVar18;
  (this->m_EntityMarking).m_sEntityMarkingString[1] = KVar19;
  (this->m_EntityMarking).m_sEntityMarkingString[2] = KVar20;
  (this->m_EntityMarking).m_sEntityMarkingString[3] = KVar21;
  (this->m_EntityMarking).m_sEntityMarkingString[4] = KVar22;
  (this->m_EntityMarking).m_sEntityMarkingString[5] = KVar23;
  (this->m_EntityMarking).m_sEntityMarkingString[6] = KVar24;
  *(undefined8 *)((this->m_EntityMarking).m_sEntityMarkingString + 4) = uVar1;
  (this->m_EntityCapabilities).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityCapabilities_00223450;
  (this->m_EntityCapabilities).field_0 = (ESPDU->m_EntityCapabilities).field_0;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::vector(&this->m_vVariableParameters,&ESPDU->m_vVariableParameters);
  pDVar2 = ESPDU->m_pDrCalc;
  if (pDVar2 == (DeadReckoningCalculator *)0x0) {
    pDVar25 = (DeadReckoningCalculator *)0x0;
  }
  else {
    pDVar25 = (DeadReckoningCalculator *)operator_new(0x170);
    (pDVar25->m_initPosition).super_DataTypeBase._vptr_DataTypeBase =
         (_func_int **)&PTR__DataTypeBase_00223b28;
    KVar3 = (pDVar2->m_initPosition).m_f64Y;
    (pDVar25->m_initPosition).m_f64X = (pDVar2->m_initPosition).m_f64X;
    (pDVar25->m_initPosition).m_f64Y = KVar3;
    (pDVar25->m_initPosition).m_f64Z = (pDVar2->m_initPosition).m_f64Z;
    (pDVar25->m_initLinearVelocity).super_DataTypeBase._vptr_DataTypeBase =
         (_func_int **)&PTR__DataTypeBase_00223ad0;
    KVar10 = (pDVar2->m_initLinearVelocity).m_f32Y;
    (pDVar25->m_initLinearVelocity).m_f32X = (pDVar2->m_initLinearVelocity).m_f32X;
    (pDVar25->m_initLinearVelocity).m_f32Y = KVar10;
    (pDVar25->m_initLinearVelocity).m_f32Z = (pDVar2->m_initLinearVelocity).m_f32Z;
    (pDVar25->m_initLinearAcceleration).super_DataTypeBase._vptr_DataTypeBase =
         (_func_int **)&PTR__DataTypeBase_00223ad0;
    KVar10 = (pDVar2->m_initLinearAcceleration).m_f32Y;
    (pDVar25->m_initLinearAcceleration).m_f32X = (pDVar2->m_initLinearAcceleration).m_f32X;
    (pDVar25->m_initLinearAcceleration).m_f32Y = KVar10;
    (pDVar25->m_initLinearAcceleration).m_f32Z = (pDVar2->m_initLinearAcceleration).m_f32Z;
    (pDVar25->m_Ab).super_DataTypeBase._vptr_DataTypeBase =
         (_func_int **)&PTR__DataTypeBase_00223ad0;
    KVar10 = (pDVar2->m_Ab).m_f32Y;
    (pDVar25->m_Ab).m_f32X = (pDVar2->m_Ab).m_f32X;
    (pDVar25->m_Ab).m_f32Y = KVar10;
    (pDVar25->m_Ab).m_f32Z = (pDVar2->m_Ab).m_f32Z;
    pDVar25->m_bQuaxAxisSet = pDVar2->m_bQuaxAxisSet;
    (pDVar25->m_quatAxis).super_DataTypeBase._vptr_DataTypeBase =
         (_func_int **)&PTR__DataTypeBase_00223ad0;
    (pDVar25->m_quatAxis).m_f32Z = (pDVar2->m_quatAxis).m_f32Z;
    KVar10 = (pDVar2->m_quatAxis).m_f32Y;
    (pDVar25->m_quatAxis).m_f32X = (pDVar2->m_quatAxis).m_f32X;
    (pDVar25->m_quatAxis).m_f32Y = KVar10;
    pDVar25->m_f64Magnitude = pDVar2->m_f64Magnitude;
    (pDVar25->m_initOrientation).super_DataTypeBase._vptr_DataTypeBase =
         (_func_int **)&PTR__EulerAngles_002235b0;
    (pDVar25->m_initOrientation).m_f32Phi = (pDVar2->m_initOrientation).m_f32Phi;
    KVar10 = (pDVar2->m_initOrientation).m_f32Theta;
    (pDVar25->m_initOrientation).m_f32Psi = (pDVar2->m_initOrientation).m_f32Psi;
    (pDVar25->m_initOrientation).m_f32Theta = KVar10;
    (pDVar25->m_initEulerAngularVelocity).super_DataTypeBase._vptr_DataTypeBase =
         (_func_int **)&PTR__EulerAngles_002235b0;
    KVar10 = (pDVar2->m_initEulerAngularVelocity).m_f32Theta;
    (pDVar25->m_initEulerAngularVelocity).m_f32Psi = (pDVar2->m_initEulerAngularVelocity).m_f32Psi;
    (pDVar25->m_initEulerAngularVelocity).m_f32Theta = KVar10;
    (pDVar25->m_initEulerAngularVelocity).m_f32Phi = (pDVar2->m_initEulerAngularVelocity).m_f32Phi;
    pTVar27 = &pDVar2->m_initOrientationMatrix;
    pTVar28 = &pDVar25->m_initOrientationMatrix;
    for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
      *(undefined8 *)pTVar28->Data[0] = *(undefined8 *)pTVar27->Data[0];
      pTVar27 = (TMATRIX *)((long)pTVar27 + (ulong)bVar29 * -0x10 + 8);
      pTVar28 = (TMATRIX *)((long)pTVar28 + (ulong)bVar29 * -0x10 + 8);
    }
    (pDVar25->m_initAngularVelocity).super_DataTypeBase._vptr_DataTypeBase =
         (_func_int **)&PTR__DataTypeBase_00223ad0;
    (pDVar25->m_initAngularVelocity).m_f32Z = (pDVar2->m_initAngularVelocity).m_f32Z;
    KVar10 = (pDVar2->m_initAngularVelocity).m_f32Y;
    (pDVar25->m_initAngularVelocity).m_f32X = (pDVar2->m_initAngularVelocity).m_f32X;
    (pDVar25->m_initAngularVelocity).m_f32Y = KVar10;
    pTVar27 = &pDVar2->m_wwMatrix;
    pTVar28 = &pDVar25->m_wwMatrix;
    for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
      *(undefined8 *)pTVar28->Data[0] = *(undefined8 *)pTVar27->Data[0];
      pTVar27 = (TMATRIX *)((long)pTVar27 + (ulong)bVar29 * -0x10 + 8);
      pTVar28 = (TMATRIX *)((long)pTVar28 + (ulong)bVar29 * -0x10 + 8);
    }
    pDVar25->m_DRA = pDVar2->m_DRA;
  }
  this->m_pDrCalc = pDVar25;
  return;
}

Assistant:

Entity_State_PDU::Entity_State_PDU( const Entity_State_PDU & ESPDU ) :
    Header( ESPDU ),
    m_EntityID( ESPDU.m_EntityID ),
    m_ui8ForceID( ESPDU.m_ui8ForceID ),
    m_ui8NumOfVariableParams( ESPDU.m_ui8NumOfVariableParams ),
    m_EntityType( ESPDU.m_EntityType ),
    m_AltEntityType( ESPDU.m_AltEntityType ),
    m_EntityLinearVelocity( ESPDU.m_EntityLinearVelocity ),
    m_EntityLocation( ESPDU.m_EntityLocation ),
    m_EntityOrientation( ESPDU.m_EntityOrientation ),
    m_EntityAppearance( ESPDU.m_EntityAppearance ),
    m_DeadReckoningParameter( ESPDU.m_DeadReckoningParameter ),
    m_EntityMarking( ESPDU.m_EntityMarking ),
    m_EntityCapabilities( ESPDU.m_EntityCapabilities ),
    m_vVariableParameters( ESPDU.m_vVariableParameters ),
    m_pDrCalc( ESPDU.m_pDrCalc ? new DeadReckoningCalculator( *ESPDU.m_pDrCalc ) : NULL )
{
}